

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

void Utils::print_vec_from_to
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,int from,int to)

{
  undefined8 in_RAX;
  ostream *poVar1;
  int iVar2;
  int iVar3;
  undefined8 uStack_38;
  
  iVar2 = to - from;
  uStack_38 = in_RAX;
  if (iVar2 != 0 && from <= to) {
    iVar3 = 0;
    do {
      if (0x18 < iVar3) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
        std::ostream::put('(');
        poVar1 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,"                                    ",0x24);
        iVar3 = 0;
      }
      *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_38 + 7),1);
      iVar3 = iVar3 + 1;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  return;
}

Assistant:

void Utils::print_vec_from_to(std::vector<unsigned int> vec, int from, int to) {
    int count = 0;
    for (int i = from; i < to; ++i) {
        if(count >= 25) {
            std::cout << endl << "                                    ";
            count = 0;
        }
        std::cout << hex << vec[i] << ' ';
        ++count;
    }
    std::cout << endl;
}